

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncryptedPDF.cpp
# Opt level: O0

int EncryptedPDF(int argc,char **argv)

{
  undefined8 uVar1;
  EncryptionOptions *pEVar2;
  PDFParser *this;
  unsigned_long uVar3;
  ostream *poVar4;
  EStatusCodeAndObjectIDType EVar5;
  EStatusCodeAndObjectIDType result;
  unsigned_long i;
  unsigned_long pagesCount;
  string local_1760;
  PDFParsingOptions local_1740;
  allocator<char> local_1719;
  string local_1718;
  string local_16f8;
  EncryptionOptions local_16d8;
  PDFCreationSettings local_1688;
  allocator<char> local_1621;
  string local_1620;
  string local_1600;
  LogConfiguration local_15e0;
  allocator<char> local_15a9;
  string local_15a8;
  string local_1588;
  undefined1 local_1568 [8];
  PDFParser parser;
  PDFDocumentCopyingContext *copyingContext;
  undefined1 local_f00 [8];
  PDFWriter pdfWriter;
  InputFile pdfFile;
  EStatusCode status;
  char **argv_local;
  int argc_local;
  
  InputFile::InputFile((InputFile *)&pdfWriter.mModifiedFileVersion);
  PDFWriter::PDFWriter((PDFWriter *)local_f00);
  parser.mAllowExtendingSegments = false;
  parser._1609_7_ = 0;
  PDFParser::PDFParser((PDFParser *)local_1568);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_15a8,"PDFWithPasswordDecrypted.pdf",&local_15a9);
  BuildRelativeOutputPath(&local_1588,argv,&local_15a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1620,"PDFWithPasswordDecrypted.txt",&local_1621);
  BuildRelativeOutputPath(&local_1600,argv,&local_1620);
  LogConfiguration::LogConfiguration(&local_15e0,true,true,&local_1600);
  pEVar2 = EncryptionOptions::DefaultEncryptionOptions();
  EncryptionOptions::EncryptionOptions(&local_16d8,pEVar2);
  PDFCreationSettings::PDFCreationSettings(&local_1688,true,true,&local_16d8,false);
  pdfFile.mFileStream._4_4_ =
       PDFWriter::StartPDF((PDFWriter *)local_f00,&local_1588,ePDFVersion13,&local_15e0,&local_1688)
  ;
  PDFCreationSettings::~PDFCreationSettings(&local_1688);
  EncryptionOptions::~EncryptionOptions(&local_16d8);
  LogConfiguration::~LogConfiguration(&local_15e0);
  std::__cxx11::string::~string((string *)&local_1600);
  std::__cxx11::string::~string((string *)&local_1620);
  std::allocator<char>::~allocator(&local_1621);
  std::__cxx11::string::~string((string *)&local_1588);
  std::__cxx11::string::~string((string *)&local_15a8);
  std::allocator<char>::~allocator(&local_15a9);
  if (pdfFile.mFileStream._4_4_ == eSuccess) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1718,"PDFWithPassword.pdf",&local_1719);
    BuildRelativeInputPath(&local_16f8,argv,&local_1718);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1760,"user",(allocator<char> *)((long)&pagesCount + 7));
    PDFParsingOptions::PDFParsingOptions(&local_1740,&local_1760);
    parser._1608_8_ =
         PDFWriter::CreatePDFCopyingContext((PDFWriter *)local_f00,&local_16f8,&local_1740);
    PDFParsingOptions::~PDFParsingOptions(&local_1740);
    std::__cxx11::string::~string((string *)&local_1760);
    std::allocator<char>::~allocator((allocator<char> *)((long)&pagesCount + 7));
    std::__cxx11::string::~string((string *)&local_16f8);
    std::__cxx11::string::~string((string *)&local_1718);
    std::allocator<char>::~allocator(&local_1719);
    if (parser._1608_8_ == 0) {
      std::operator<<((ostream *)&std::cout,
                      "failed to initialize copying context from PDFWithPassword.pdf\n");
      pdfFile.mFileStream._4_4_ = eFailure;
    }
    else {
      this = PDFDocumentCopyingContext::GetSourceDocumentParser
                       ((PDFDocumentCopyingContext *)parser._1608_8_);
      uVar3 = PDFParser::GetPagesCount(this);
      for (result.second = 0; result.second < uVar3; result.second = result.second + 1) {
        EVar5 = PDFDocumentCopyingContext::AppendPDFPageFromPDF
                          ((PDFDocumentCopyingContext *)parser._1608_8_,result.second);
        if (EVar5.first != eSuccess) {
          poVar4 = std::operator<<((ostream *)&std::cout,"failed to append page ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,result.second + 1);
          std::operator<<(poVar4," from PDFWithPassword.pdf\n");
          break;
        }
      }
      uVar1 = parser._1608_8_;
      if (parser._1608_8_ != 0) {
        PDFDocumentCopyingContext::~PDFDocumentCopyingContext
                  ((PDFDocumentCopyingContext *)parser._1608_8_);
        operator_delete((void *)uVar1,0xd0);
      }
      parser.mAllowExtendingSegments = false;
      parser._1609_7_ = 0;
      pdfFile.mFileStream._4_4_ = PDFWriter::EndPDF((PDFWriter *)local_f00);
      if (pdfFile.mFileStream._4_4_ != eSuccess) {
        std::operator<<((ostream *)&std::cout,"failed in end PDF\n");
      }
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,"failed to start PDF\n");
  }
  uVar1 = parser._1608_8_;
  if (parser._1608_8_ != 0) {
    PDFDocumentCopyingContext::~PDFDocumentCopyingContext
              ((PDFDocumentCopyingContext *)parser._1608_8_);
    operator_delete((void *)uVar1,0xd0);
  }
  PDFParser::~PDFParser((PDFParser *)local_1568);
  PDFWriter::~PDFWriter((PDFWriter *)local_f00);
  InputFile::~InputFile((InputFile *)&pdfWriter.mModifiedFileVersion);
  return (uint)(pdfFile.mFileStream._4_4_ != eSuccess);
}

Assistant:

int EncryptedPDF(int argc, char* argv[])
{
	EStatusCode status = PDFHummus::eSuccess;
	InputFile pdfFile;
	PDFWriter pdfWriter;
	PDFDocumentCopyingContext* copyingContext = NULL;


	PDFParser parser;

	do
	{
		status = pdfWriter.StartPDF(
			BuildRelativeOutputPath(argv, "PDFWithPasswordDecrypted.pdf"), ePDFVersion13,
			LogConfiguration(true, true,
				BuildRelativeOutputPath(argv, "PDFWithPasswordDecrypted.txt")));
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed to start PDF\n";
			break;
		}

		copyingContext = pdfWriter.CreatePDFCopyingContext(
			BuildRelativeInputPath(argv,"PDFWithPassword.pdf"),
			PDFParsingOptions("user"));
		if (!copyingContext)
		{
			cout << "failed to initialize copying context from PDFWithPassword.pdf\n";
			status = PDFHummus::eFailure;
			break;
		}

		unsigned long pagesCount = copyingContext->GetSourceDocumentParser()->GetPagesCount();
		for (unsigned long i = 0; i < pagesCount && status == PDFHummus::eSuccess; ++i) {
			EStatusCodeAndObjectIDType result = copyingContext->AppendPDFPageFromPDF(i);
			if (result.first != PDFHummus::eSuccess)
			{
				cout << "failed to append page "<<(i+1)<<" from PDFWithPassword.pdf\n";
				status = result.first;
				break;
			}

		}

		delete copyingContext;
		copyingContext = NULL;

		status = pdfWriter.EndPDF();
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed in end PDF\n";
			break;
		}

	} while (false);

	delete copyingContext;
	return status == eSuccess ? 0:1;
}